

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

void __thiscall
DatabaseSnapshot::read_iterator
          (DatabaseSnapshot *this,Task *task,string *iterator_id,int count,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out,uint64_t *out_iterator_position,uint64_t *out_iterator_files)

{
  bool bVar1;
  runtime_error *this_00;
  DBChange *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *obj_name;
  string *parameter;
  DatabaseName *this_02;
  OnDiskIterator *pOVar2;
  uint64_t *in_R9;
  uint64_t *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  int in_stack_0000001c;
  OnDiskIterator *in_stack_00000020;
  string param;
  string file_offset;
  string byte_offset;
  OnDiskIterator iterator_copy;
  const_iterator it;
  DBChange *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  OnDiskIterator *in_stack_fffffffffffffd48;
  OnDiskIterator *in_stack_fffffffffffffd50;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  OnDiskIterator local_1b0;
  _Self local_40;
  _Self local_38;
  uint64_t *local_30;
  
  *in_stack_00000008 = 0;
  *in_R9 = 0;
  local_30 = in_R9;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
               *)in_stack_fffffffffffffd28,(key_type *)0x193f0d);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
              *)in_stack_fffffffffffffd28);
  bVar1 = std::operator==(&local_38,&local_40);
  if (!bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>
                  *)0x193fb4);
    pOVar2 = &local_1b0;
    OnDiskIterator::OnDiskIterator(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    OnDiskIterator::pop(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
    this_01 = (DBChange *)OnDiskIterator::get_total_files(&local_1b0);
    *in_stack_00000008 = (uint64_t)this_01;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            OnDiskIterator::get_file_offset(&local_1b0);
    *local_30 = (uint64_t)__lhs;
    obj_name = (string *)OnDiskIterator::get_byte_offset(&local_1b0);
    std::__cxx11::to_string((unsigned_long)pOVar2);
    parameter = (string *)OnDiskIterator::get_file_offset(&local_1b0);
    std::__cxx11::to_string((unsigned_long)pOVar2);
    std::operator+(__lhs,(char *)obj_name);
    std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_230);
    this_02 = OnDiskIterator::get_name(&local_1b0);
    pOVar2 = (OnDiskIterator *)DatabaseName::get_filename_abi_cxx11_(this_02);
    DBChange::DBChange(this_01,(DbChangeType *)__lhs,obj_name,parameter);
    Task::change((Task *)pOVar2,in_stack_fffffffffffffd28);
    DBChange::~DBChange((DBChange *)pOVar2);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string(local_1f0);
    std::__cxx11::string::~string(local_1d0);
    OnDiskIterator::~OnDiskIterator(pOVar2);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"tried to read non-existent iterator");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DatabaseSnapshot::read_iterator(Task *task, const std::string &iterator_id,
                                     int count, std::vector<std::string> *out,
                                     uint64_t *out_iterator_position,
                                     uint64_t *out_iterator_files) const {
    *out_iterator_files = 0;
    *out_iterator_position = 0;

    auto it = iterators.find(iterator_id);
    if (it == iterators.end()) {
        throw std::runtime_error("tried to read non-existent iterator");
    }

    OnDiskIterator iterator_copy = it->second;
    iterator_copy.pop(count, out);
    *out_iterator_files = iterator_copy.get_total_files();
    *out_iterator_position = iterator_copy.get_file_offset();

    std::string byte_offset = std::to_string(iterator_copy.get_byte_offset());
    std::string file_offset = std::to_string(iterator_copy.get_file_offset());
    std::string param = byte_offset + ":" + file_offset;
    task->change(DBChange(DbChangeType::UpdateIterator,
                          iterator_copy.get_name().get_filename(), param));
}